

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createSingleShaderProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ShaderType shaderType,string *src)

{
  qpShaderType type;
  RenderContext *source;
  bool bVar1;
  GLenum GVar2;
  TestLog *this_00;
  MessageBuilder *this_01;
  TestLog *pTVar3;
  TestError *pTVar4;
  RawProgramWrapper *pRVar5;
  Program *this_02;
  TestLog *this_03;
  undefined8 extraout_RAX;
  double __x;
  double __x_00;
  double __x_01;
  Program *program;
  RawProgramWrapper *local_2a8;
  RawProgramWrapper *wrapper;
  string local_298;
  LogShader local_278;
  allocator<char> local_221;
  string local_220;
  LogShaderProgram local_200;
  MessageBuilder local_1c8;
  qpShaderType local_44;
  GLuint local_40;
  qpShaderType qpType;
  GLuint programName;
  GLenum glType;
  char *srcStr;
  RenderContext *renderCtx;
  string *src_local;
  SeparateShaderTest *pSStack_18;
  ShaderType shaderType_local;
  SeparateShaderTest *this_local;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *wrapperPtr;
  
  renderCtx = (RenderContext *)src;
  src_local._4_4_ = shaderType;
  pSStack_18 = this;
  this_local = (SeparateShaderTest *)__return_storage_ptr__;
  srcStr = (char *)getRenderContext(this);
  if (((this->m_params).useCreateHelper & 1U) == 0) {
    if (src_local._4_4_ == SHADERTYPE_VERTEX) {
      createShaderProgram(__return_storage_ptr__,this,(string *)renderCtx,(string *)0x0,true);
    }
    else if (src_local._4_4_ == SHADERTYPE_FRAGMENT) {
      createShaderProgram(__return_storage_ptr__,this,(string *)0x0,(string *)renderCtx,true);
    }
    else {
      de::details::
      MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      ::MovePtr(__return_storage_ptr__);
    }
  }
  else {
    _programName = (GLchar *)std::__cxx11::string::c_str();
    qpType = glu::getGLShaderType(src_local._4_4_);
    local_40 = glu::CallLogWrapper::glCreateShaderProgramv
                         (&this->super_CallLogWrapper,qpType,1,(GLchar **)&programName);
    GVar2 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    if ((GVar2 != 0) || (local_40 == 0)) {
      local_44 = glu::getLogShaderType(src_local._4_4_);
      log(this,__x);
      tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_1c8,(char (*) [32])"glCreateShaderProgramv() failed");
      pTVar3 = tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"[glCreateShaderProgramv() failed]",&local_221);
      tcu::LogShaderProgram::LogShaderProgram(&local_200,false,&local_220);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_200);
      source = renderCtx;
      type = local_44;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"[glCreateShaderProgramv() failed]",
                 (allocator<char> *)((long)&wrapper + 7));
      tcu::LogShader::LogShader(&local_278,type,(string *)source,false,&local_298);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_278);
      tcu::TestLog::operator<<(pTVar3,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
      tcu::LogShader::~LogShader(&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)((long)&wrapper + 7));
      tcu::LogShaderProgram::~LogShaderProgram(&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"glCreateShaderProgramv() failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                 ,0x46f);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pRVar5 = (RawProgramWrapper *)operator_new(0x70);
    RawProgramWrapper::RawProgramWrapper
              (pRVar5,(RenderContext *)srcStr,local_40,src_local._4_4_,(string *)renderCtx);
    program._7_1_ = 0;
    local_2a8 = pRVar5;
    de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>::
    DefaultDeleter((DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>
                    *)((long)&program + 6));
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::MovePtr(__return_storage_ptr__,pRVar5);
    this_02 = RawProgramWrapper::getProgram(local_2a8);
    bVar1 = glu::Program::getLinkStatus(this_02);
    if (!bVar1) {
      log(this,__x_00);
      tcu::TestLog::writeMessage(this_03,"glCreateShaderProgramv() failed at linking");
      pRVar5 = local_2a8;
      log(this,__x_01);
      (*(pRVar5->super_ProgramWrapper)._vptr_ProgramWrapper[3])(pRVar5,extraout_RAX);
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"glCreateShaderProgram() failed at linking",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                 ,0x47b);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createSingleShaderProgram (ShaderType shaderType,
																	   const string& src)
{
	const RenderContext&	renderCtx	= getRenderContext();

	if (m_params.useCreateHelper)
	{
		const char*	const	srcStr		= src.c_str();
		const GLenum		glType		= glu::getGLShaderType(shaderType);
		const GLuint		programName	= glCreateShaderProgramv(glType, 1, &srcStr);

		if (glGetError() != GL_NO_ERROR || programName == 0)
		{
			qpShaderType qpType = glu::getLogShaderType(shaderType);

			log() << TestLog::Message << "glCreateShaderProgramv() failed"
				  << TestLog::EndMessage
				  << TestLog::ShaderProgram(false, "[glCreateShaderProgramv() failed]")
				  << TestLog::Shader(qpType, src,
									 false, "[glCreateShaderProgramv() failed]")
				  << TestLog::EndShaderProgram;
			TCU_FAIL("glCreateShaderProgramv() failed");
		}

		RawProgramWrapper* const	wrapper	= new RawProgramWrapper(renderCtx, programName,
																	shaderType, src);
		MovePtr<ProgramWrapper>		wrapperPtr(wrapper);
		Program&					program = wrapper->getProgram();

		if (!program.getLinkStatus())
		{
			log().writeMessage("glCreateShaderProgramv() failed at linking");
			wrapper->writeToLog(log());
			TCU_FAIL("glCreateShaderProgram() failed at linking");
		}
		return wrapperPtr;
	}
	else
	{
		switch (shaderType)
		{
			case glu::SHADERTYPE_VERTEX:
				return createShaderProgram(&src, DE_NULL, true);
			case glu::SHADERTYPE_FRAGMENT:
				return createShaderProgram(DE_NULL, &src, true);
			default:
				DE_FATAL("Impossible case");
		}
	}
	return MovePtr<ProgramWrapper>(); // Shut up compiler warnings.
}